

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O0

istream * utility::read<std::vector<short,std::allocator<short>>>
                    (istream *stream,vector<short,_std::allocator<short>_> *values)

{
  size_t this;
  bool bVar1;
  istream *piVar2;
  long local_48;
  int64_t n;
  short *value;
  iterator __end0;
  iterator __begin0;
  vector<short,_std::allocator<short>_> *__range3;
  size_t size;
  vector<short,_std::allocator<short>_> *values_local;
  istream *stream_local;
  
  __range3 = (vector<short,_std::allocator<short>_> *)0x0;
  size = (size_t)values;
  values_local = (vector<short,_std::allocator<short>_> *)stream;
  piVar2 = burst::trivial_read_fn::operator()
                     ((trivial_read_fn *)&burst::trivial_read,stream,(unsigned_long *)&__range3);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
  if (bVar1) {
    std::vector<short,_std::allocator<short>_>::resize
              ((vector<short,_std::allocator<short>_> *)size,(size_type)__range3);
    this = size;
    __end0 = std::vector<short,_std::allocator<short>_>::begin
                       ((vector<short,_std::allocator<short>_> *)size);
    value = (short *)std::vector<short,_std::allocator<short>_>::end
                               ((vector<short,_std::allocator<short>_> *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>
                                       *)&value), bVar1) {
      n = (int64_t)__gnu_cxx::
                   __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
                   operator*(&__end0);
      local_48 = 0;
      burst::trivial_read_fn::operator()
                ((trivial_read_fn *)&burst::trivial_read,(istream *)values_local,&local_48);
      *(short *)n = (short)local_48;
      __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::operator++
                (&__end0);
    }
  }
  return (istream *)values_local;
}

Assistant:

std::istream & read (std::istream & stream, Container & values)
    {
        auto size = std::size_t{};
        if (burst::trivial_read(stream, size))
        {
            values.resize(size);

            for (auto & value: values)
            {
                auto n = std::int64_t{};
                burst::trivial_read(stream, n);
                value = static_cast<typename Container::value_type>(n);
            }
        }

        return stream;
    }